

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typesystem_parser.cpp
# Opt level: O2

void __thiscall franca::TypeDefinitionParser::TypeDefinitionParser(TypeDefinitionParser *this)

{
  Rule<ast::TypeDefinition_()> *this_00;
  string *this_01;
  TypeParser *pTVar1;
  Rule<ast::ArrayType_()> *this_02;
  Rule<ast::EnumerationType_()> *this_03;
  char *pcVar2;
  undefined8 uVar3;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
  eVar4;
  _Alloc_hider _Var5;
  undefined8 uVar6;
  Rule<std::string_()> *this_04;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>
  that;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>,_boost::fusion::vector<char>_>_>,_0L>
  that_3;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>
  that_1;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>,_boost::fusion::vector<char>_>_>,_0L>
  that_4;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>
  that_2;
  TypeParser *local_140;
  function_buffer *local_138;
  string local_130;
  undefined1 local_110 [24];
  undefined1 local_f8 [8];
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  proto_child0 local_c0;
  function_buffer local_b8;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
  local_a0;
  _Alloc_hider local_98;
  Rule<ast::AliasType_()> *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  Rule<ast::StructType_()> *local_78;
  function_buffer local_70;
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  local_58;
  _Alloc_hider local_50;
  Rule<ast::TypeDefinition_()> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  std::__cxx11::string::string((string *)&local_130,"unnamed-grammar",(allocator *)&local_140);
  this_00 = &this->type_definition_;
  (this->
  super_grammar<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::grammar<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = this_00;
  this_01 = &(this->
             super_grammar<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
             ).name_;
  std::__cxx11::string::string((string *)this_01,(string *)&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  local_40._8_8_ = this_01;
  std::__cxx11::string::string((string *)&local_130,"unnamed-rule",(allocator *)&local_140);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(this_00,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  local_70.members.obj_ptr = &this->type_;
  local_48 = this_00;
  TypeParser::TypeParser((TypeParser *)local_70.members._0_8_);
  local_50._M_p = (pointer)&this->expression_;
  ExpressionParser::ExpressionParser((ExpressionParser *)local_50._M_p);
  std::__cxx11::string::string((string *)&local_130,"unnamed-rule",(allocator *)&local_140);
  this_02 = &this->array_type_;
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(this_02,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  local_40._M_allocated_capacity = (size_type)this_02;
  std::__cxx11::string::string((string *)&local_130,"unnamed-rule",(allocator *)&local_140);
  this_03 = &this->enumeration_type_;
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::EnumerationType_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(this_03,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  local_58.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )(expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
          )this_03;
  std::__cxx11::string::string((string *)&local_130,"unnamed-rule",(allocator *)&local_140);
  local_78 = &this->struct_type_;
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::StructType_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(local_78,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::string((string *)&local_130,"unnamed-rule",(allocator *)&local_140);
  local_88._8_8_ = &this->union_type_;
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::UnionType_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule((rule<const_char_*,_franca::SkipGrammar,_fidler::ast::UnionType_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)local_88._8_8_,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::string((string *)&local_130,"unnamed-rule",(allocator *)&local_140);
  local_88._M_allocated_capacity = (size_type)&this->map_type_;
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::MapType_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule((rule<const_char_*,_franca::SkipGrammar,_fidler::ast::MapType_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)local_88._M_allocated_capacity,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::string((string *)&local_130,"unnamed-rule",(allocator *)&local_140);
  local_90 = &this->alias_type_;
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::AliasType_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(local_90,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::string((string *)&local_130,"unnamed-rule",(allocator *)&local_140);
  local_98._M_p = (pointer)&this->enumerator_;
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule((rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)local_98._M_p,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::string((string *)&local_130,"unnamed-rule",(allocator *)&local_140);
  local_a0.child0.ref.t_ = (proto_child0)&this->field_;
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Field_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule((rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Field_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)local_a0.child0.ref.t_,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::string((string *)&local_130,"unnamed-rule",(allocator *)&local_140);
  local_b8._16_8_ = &this->fqn_;
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule((rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)local_b8._16_8_,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::string((string *)&local_130,"unnamed-rule",(allocator *)&local_140);
  this_04 = &this->id_;
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(this_04,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  local_110._16_8_ = &local_f0;
  local_110._0_8_ = (long)local_110 + 0x10;
  local_f8 = (undefined1  [8])local_78;
  local_110._8_8_ = local_88._8_8_;
  local_138 = (function_buffer *)local_88._M_allocated_capacity;
  local_130._M_string_length = (size_type)local_90;
  local_140 = (TypeParser *)local_110;
  local_130._M_dataplus._M_p = (pointer)&local_140;
  local_f0 = this_02;
  local_e8._M_allocated_capacity = (size_type)this_03;
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,boost::variant<fidler::ast::ArrayType,fidler::ast::EnumerationType,fidler::ast::StructType,fidler::ast::UnionType,fidler::ast::MapType,fidler::ast::AliasType>(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::spirit::qi::rule<char_const*,franca::SkipGrammar,fidler::ast::ArrayType(),boost::spirit::unused_type,boost::spirit::unused_type>&,boost::spirit::qi::rule<char_const*,franca::SkipGrammar,fidler::ast::EnumerationType(),boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&,boost::spirit::qi::rule<char_const*,franca::SkipGrammar,fidler::ast::StructType(),boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&,boost::spirit::qi::rule<char_const*,franca::SkipGrammar,fidler::ast::UnionType(),boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&,boost::spirit::qi::rule<char_const*,franca::SkipGrammar,fidler::ast::MapType(),boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&,boost::spirit::qi::rule<char_const*,franca::SkipGrammar,fidler::ast::AliasType(),boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>>
            (local_48,&local_130);
  uVar6 = local_70.members._0_8_;
  local_110._0_8_ = "array";
  local_138 = (function_buffer *)0x6187d4;
  local_130._M_string_length = (size_type)local_70.members._0_8_;
  local_140 = (TypeParser *)local_110;
  local_130._M_dataplus._M_p = (pointer)&local_140;
  local_110._8_8_ = this_04;
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,fidler::ast::ArrayType(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[6]>,0l>,boost::spirit::qi::rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[3]>,0l>>,2l>const&,franca::TypeParser&>,2l>>
            (this_02);
  _Var5._M_p = local_98._M_p;
  uVar3 = local_b8._16_8_;
  local_110._0_8_ = "typedef";
  local_138 = (function_buffer *)0x6187df;
  local_130._M_string_length = uVar6;
  local_140 = (TypeParser *)local_110;
  local_130._M_dataplus._M_p = (pointer)&local_140;
  local_110._8_8_ = this_04;
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,fidler::ast::AliasType(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[8]>,0l>,boost::spirit::qi::rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[3]>,0l>>,2l>const&,franca::TypeParser&>,2l>>
            (local_90);
  local_f0 = (rule<const_char_*,_franca::SkipGrammar,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
              *)0x6187e2;
  local_b8.members.obj_ptr = &local_d0;
  local_d0._M_allocated_capacity = (size_type)"extends";
  local_d0._8_8_ = uVar3;
  local_f8 = (undefined1  [8])&local_b8;
  local_110._16_8_ = &local_f0;
  local_110._8_8_ = &local_d8;
  local_d8.proto_expr_.child0.ref.t_._0_1_ = 0x7b;
  pcVar2 = local_70.data + 8;
  local_70._8_8_ = _Var5._M_p;
  local_140 = (TypeParser *)local_110;
  local_c0.ref.t_._0_1_ = 0x7d;
  local_138 = (function_buffer *)pcVar2;
  local_130._M_dataplus._M_p = (pointer)&local_140;
  local_130._M_string_length = (size_type)&local_c0;
  local_110._0_8_ = (long)local_110 + 0x10;
  local_e8._M_allocated_capacity = (size_type)this_04;
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,fidler::ast::EnumerationType(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[12]>,0l>,boost::spirit::qi::rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[8]>,0l>,boost::spirit::qi::rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::spirit::qi::rule<char_const*,franca::SkipGrammar,fidler::ast::Enumerator(),boost::spirit::unused_type,boost::spirit::unused_type>&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>>
            (local_58.proto_expr_.child0.ref.t_);
  eVar4.child0.ref.t_ = local_a0.child0.ref.t_;
  local_d0._M_allocated_capacity = (size_type)"struct";
  local_70._8_8_ = &boost::spirit::matches;
  local_70._16_8_ = (long)" polymorphic" + 1;
  local_110._8_8_ = local_e8._M_local_buf + 0xf;
  local_e8._M_local_buf[0xf] = '{';
  local_130._M_string_length = (size_type)(local_e8._M_local_buf + 0xe);
  local_e8._M_local_buf[0xe] = '}';
  local_b8.members.obj_ptr = "extends";
  local_b8._8_8_ = uVar3;
  local_d8.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )&local_b8;
  local_f0 = (rule<const_char_*,_franca::SkipGrammar,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
              *)&local_d0;
  local_e8._M_allocated_capacity = (size_type)&local_d8;
  local_c0.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )local_a0.child0.ref.t_;
  local_140 = (TypeParser *)local_110;
  local_138 = (function_buffer *)&local_c0;
  local_130._M_dataplus._M_p = (pointer)&local_140;
  local_110._0_8_ = (long)local_110 + 0x10;
  local_110._16_8_ = &local_f0;
  local_f8 = (undefined1  [8])pcVar2;
  local_d0._8_8_ = this_04;
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,fidler::ast::StructType(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[7]>,0l>,boost::spirit::qi::rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::pr___exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>>
            (local_78);
  local_f0 = (rule<const_char_*,_franca::SkipGrammar,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
              *)0x6187f5;
  local_d0._M_allocated_capacity = (size_type)"extends";
  local_d0._8_8_ = uVar3;
  local_d8.proto_expr_.child0.ref.t_._0_1_ = 0x7b;
  local_110._0_8_ = (long)local_110 + 0x10;
  local_110._8_8_ = &local_d8;
  local_70._8_8_ = eVar4.child0.ref.t_;
  local_140 = (TypeParser *)local_110;
  local_c0.ref.t_._0_1_ = 0x7d;
  local_130._M_dataplus._M_p = (pointer)&local_140;
  local_138 = (function_buffer *)pcVar2;
  local_130._M_string_length = (size_type)&local_c0;
  local_110._16_8_ = &local_f0;
  local_f8 = (undefined1  [8])&local_b8;
  local_e8._M_allocated_capacity = (size_type)this_04;
  local_b8.members._0_8_ = (undefined8)&local_d0;
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,fidler::ast::UnionType(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[6]>,0l>,boost::spirit::qi::rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[8]>,0l>,boost::spirit::qi::rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::spirit::qi::rule<char_const*,franca::SkipGrammar,fidler::ast::Field(),boost::spirit::unused_type,boost::spirit::unused_type>&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>>
            (local_88._8_8_);
  uVar6 = local_70.members._0_8_;
  local_d0._M_allocated_capacity = (size_type)"map";
  local_b8.data[0] = 0x7b;
  local_f8 = (undefined1  [8])local_70.members._0_8_;
  local_110._0_8_ = (long)local_110 + 0x10;
  local_110._8_8_ = "to";
  local_140 = (TypeParser *)local_110;
  local_138 = (function_buffer *)local_70.members._0_8_;
  local_70.data[8] = '}';
  local_130._M_string_length = (size_type)(local_70.data + 8);
  local_130._M_dataplus._M_p = (pointer)&local_140;
  local_110._16_8_ = &local_f0;
  local_f0 = (rule<const_char_*,_franca::SkipGrammar,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
              *)&local_d0;
  local_e8._M_allocated_capacity = (size_type)&local_b8;
  local_d0._8_8_ = this_04;
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,fidler::ast::MapType(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[4]>,0l>,boost::spirit::qi::rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&,franca::TypeParser&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[3]>,0l>>,2l>const&,franca::TypeParser&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>>
            (local_88._M_allocated_capacity);
  uVar3 = local_b8._16_8_;
  local_f0 = (rule<const_char_*,_franca::SkipGrammar,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
              *)CONCAT71(local_f0._1_7_,0x5b);
  local_d0._M_local_buf[0] = 0x5d;
  local_110._0_8_ = &boost::spirit::matches;
  pTVar1 = (TypeParser *)(local_110 + 0x10);
  local_140 = (TypeParser *)uVar6;
  local_138 = (function_buffer *)local_110;
  local_130._M_dataplus._M_p = (pointer)&local_140;
  local_130._M_string_length = (size_type)this_04;
  local_110._8_8_ = pTVar1;
  local_110._16_8_ = &local_f0;
  local_f8 = (undefined1  [8])&local_d0;
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,fidler::ast::Field(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<franca::TypeParser&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::matches>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char>>>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char>>>,0l>const&>,2l>const&>,2l>const&>,2l>const&,boost::spirit::qi::rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>>
            (local_a0.child0.ref.t_);
  local_110[0x10] = 0x3d;
  local_138 = (function_buffer *)local_50._M_p;
  local_140 = pTVar1;
  local_130._M_dataplus._M_p = (pointer)this_04;
  local_130._M_string_length = (size_type)local_110;
  local_110._0_8_ = &local_140;
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,fidler::ast::Enumerator(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::spirit::qi::rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>,franca::ExpressionParser&>,2l>const&>,1l>const&>,2l>>
            (local_98._M_p);
  local_110[0] = 0x2e;
  local_130._M_dataplus._M_p = "";
  local_140 = (TypeParser *)this_04;
  local_138 = (function_buffer *)local_110;
  local_130._M_string_length = (size_type)&local_140;
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::raw>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::modulus,boost::proto::argsns_::list2<boost::spirit::qi::rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&>,2l>>
            (uVar3);
  local_b8.members.obj_ptr = &local_f0;
  local_70.data[8] = 0x5e;
  local_d0._M_allocated_capacity = (size_type)(local_70.data + 8);
  local_d8.proto_expr_.child0.ref.t_._0_1_ = 0x5f;
  local_110._16_8_ = &boost::spirit::standard::alpha;
  local_f8 = (undefined1  [8])&local_d8;
  local_110._0_8_ = &local_d0;
  local_c0.ref.t_._0_1_ = 0x5f;
  local_f0 = (rule<const_char_*,_franca::SkipGrammar,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
              *)&boost::spirit::standard::alnum;
  local_e8._M_allocated_capacity = (size_type)&local_c0;
  local_130._M_dataplus._M_p = "";
  local_140 = (TypeParser *)local_110;
  local_138 = &local_b8;
  local_130._M_string_length = (size_type)&local_140;
  local_110._8_8_ = pTVar1;
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::lexeme>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char>>>,0l>const&>,1l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alpha,boost::spirit::char_encoding::standard>>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::standard>,boost::fusion::vector<char>>>,0l>const&>,2l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alnum,boost::spirit::char_encoding::standard>>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::standard>,boost::fusion::vector<char>>>,0l>const&>,2l>const&>,1l>const&>,2l>const&>,2l>>
            (this_04);
  return;
}

Assistant:

TypeDefinitionParser::TypeDefinitionParser() :
		TypeDefinitionParser::base_type(type_definition_)
{
	namespace qi = boost::spirit::qi;

	type_definition_
		%= array_type_
		| enumeration_type_
		| struct_type_
		| union_type_
		| map_type_
		| alias_type_
		;

	array_type_
		%= "array"
		> id_
		> "of"
		> type_
		;

	alias_type_
		%= "typedef"
		> id_
		> "is"
		> type_
		;

	enumeration_type_
		%= "enumeration"
		> id_
		> -("extends" > fqn_)
		> '{'
		> *enumerator_
		> '}'
		;

	struct_type_
		%= "struct"
		> id_
		> -("extends" > fqn_)
		> qi::matches["polymorphic"]
		> '{'
		> *field_
		> '}'
		;

	union_type_
		%= "union"
		> id_
		> -("extends" > fqn_)
		> '{'
		> *field_
		> '}'
		;

	map_type_
		%= "map"
		> id_
		> '{'
		> type_
		> "to"
		> type_
		> '}'
		;

	field_
		%= type_
		> qi::matches[qi::lit('[') > qi::lit(']')]
		> id_
		;

	enumerator_
		%= id_
		>> -('=' > expression_)
		;

	fqn_
		%= qi::raw[id_ % '.']
		;

	id_
		%= qi::lexeme[-qi::lit('^') >> (qi::alpha | qi::char_('_')) >> *(qi::alnum | qi::char_('_'))]
		;
}